

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9BalanceLut(Abc_Frame_t *pAbc,int argc,char **argv)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  uint nLutSize;
  uint nCutNum;
  Gia_Man_t *pGVar4;
  char *pcVar5;
  char *pcVar6;
  int iVar7;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  
  bVar2 = false;
  Extra_UtilGetoptReset();
  local_44 = 1;
  nCutNum = 8;
  nLutSize = 6;
  local_40 = 1;
  local_48 = 1;
  local_4c = 0;
switchD_00272bbe_caseD_77:
  do {
    iVar3 = Extra_UtilGetopt(argc,argv,"KCnmravwh");
    iVar7 = globalUtilOptind;
    if (0x60 < iVar3) {
      switch(iVar3) {
      case 0x6d:
        local_44 = local_44 ^ 1;
        break;
      case 0x6e:
        bVar2 = (bool)(bVar2 ^ 1);
        break;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
      case 0x74:
      case 0x75:
        goto switchD_00272bbe_caseD_6f;
      case 0x72:
        local_40 = local_40 ^ 1;
        break;
      case 0x76:
        local_4c = local_4c ^ 1;
        break;
      case 0x77:
        break;
      default:
        if (iVar3 != 0x61) goto switchD_00272bbe_caseD_6f;
        local_48 = local_48 ^ 1;
      }
      goto switchD_00272bbe_caseD_77;
    }
    if (iVar3 == 0x43) {
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-C\" should be followed by a char string.\n";
LAB_00272cb7:
        Abc_Print(-1,pcVar5);
        goto switchD_00272bbe_caseD_6f;
      }
      nCutNum = atoi(argv[globalUtilOptind]);
      uVar1 = nCutNum;
    }
    else {
      if (iVar3 != 0x4b) {
        if (iVar3 == -1) {
          pGVar4 = pAbc->pGia;
          if (pGVar4 != (Gia_Man_t *)0x0) {
            if (bVar2) {
              pGVar4 = Gia_ManBalanceLut(pGVar4,nLutSize,nCutNum,local_4c);
            }
            else {
              pGVar4 = Gia_ManLutBalance(pGVar4,nLutSize,local_44,local_40,local_48,local_4c);
            }
            Abc_FrameUpdateGia(pAbc,pGVar4);
            return 0;
          }
          pcVar5 = "Abc_CommandAbc9BalanceLut(): There is no AIG.\n";
          iVar7 = -1;
          goto LAB_00272db5;
        }
        goto switchD_00272bbe_caseD_6f;
      }
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-K\" should be followed by a char string.\n";
        goto LAB_00272cb7;
      }
      nLutSize = atoi(argv[globalUtilOptind]);
      uVar1 = nLutSize;
    }
    globalUtilOptind = iVar7 + 1;
    if ((int)uVar1 < 0) {
switchD_00272bbe_caseD_6f:
      Abc_Print(-2,"usage: &blut [-KC num] [-mravh]\n");
      Abc_Print(-2,"\t           performs AIG balancing for the given LUT size\n");
      Abc_Print(-2,"\t-K num   : LUT size for the mapping (2 <= K <= %d) [default = %d]\n",6,
                (ulong)nLutSize);
      Abc_Print(-2,"\t-C num   : the max number of priority cuts (1 <= C <= %d) [default = %d]\n",8,
                (ulong)nCutNum);
      pcVar6 = "yes";
      pcVar5 = "yes";
      if (local_44 == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-m       : toggle performing MUX restructuring [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (local_40 == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-r       : toggle performing recursive restructuring [default = %s]\n",pcVar5)
      ;
      pcVar5 = "yes";
      if (local_48 == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-a       : toggle performing area-oriented restructuring [default = %s]\n",
                pcVar5);
      if (local_4c == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-v       : toggle printing verbose information [default = %s]\n",pcVar6);
      pcVar5 = "\t-h       : print the command usage\n";
      iVar7 = -2;
LAB_00272db5:
      Abc_Print(iVar7,pcVar5);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9BalanceLut( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Gia_ManBalanceLut( Gia_Man_t * p, int nLutSize, int nCutNum, int fVerbose );
    extern Gia_Man_t * Gia_ManLutBalance( Gia_Man_t * p, int nLutSize, int fUseMuxes, int fRecursive, int fOptArea, int fVerbose );
    Gia_Man_t * pTemp = NULL;
    int fUseOld      = 0;
    int nLutSize     = 6;
    int nCutNum      = 8;
    int fUseMuxes    = 1;
    int fRecursive   = 1;
    int fOptArea     = 1;
    int c, fVerbose  = 0;
    int fVeryVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "KCnmravwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by a char string.\n" );
                goto usage;
            }
            nLutSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLutSize < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by a char string.\n" );
                goto usage;
            }
            nCutNum = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nCutNum < 0 )
                goto usage;
            break;
        case 'n':
            fUseOld ^= 1;
            break;
        case 'm':
            fUseMuxes ^= 1;
            break;
        case 'r':
            fRecursive ^= 1;
            break;
        case 'a':
            fOptArea ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'w':
            fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9BalanceLut(): There is no AIG.\n" );
        return 1;
    }
    if ( fUseOld )
        pTemp = Gia_ManBalanceLut( pAbc->pGia, nLutSize, nCutNum, fVerbose );
    else
        pTemp = Gia_ManLutBalance( pAbc->pGia, nLutSize, fUseMuxes, fRecursive, fOptArea, fVerbose );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &blut [-KC num] [-mravh]\n" );
    Abc_Print( -2, "\t           performs AIG balancing for the given LUT size\n" );
    Abc_Print( -2, "\t-K num   : LUT size for the mapping (2 <= K <= %d) [default = %d]\n", 6, nLutSize );
    Abc_Print( -2, "\t-C num   : the max number of priority cuts (1 <= C <= %d) [default = %d]\n", 8, nCutNum );
    Abc_Print( -2, "\t-m       : toggle performing MUX restructuring [default = %s]\n", fUseMuxes? "yes": "no" );
    Abc_Print( -2, "\t-r       : toggle performing recursive restructuring [default = %s]\n", fRecursive? "yes": "no" );
    Abc_Print( -2, "\t-a       : toggle performing area-oriented restructuring [default = %s]\n", fOptArea? "yes": "no" );
    Abc_Print( -2, "\t-v       : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
//    Abc_Print( -2, "\t-w       : toggle printing additional information [default = %s]\n", fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}